

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Distribution.cpp
# Opt level: O2

void __thiscall Distribution::Distribution(Distribution *this)

{
  uint uVar1;
  random_device rd;
  random_device rStack_2728;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  local_13a0;
  
  this->_vptr_Distribution = (_func_int **)&PTR___cxa_pure_virtual_0010cd00;
  std::random_device::random_device(&this->rd);
  *(undefined4 *)&(this->distrib)._M_param._M_a = 0;
  *(undefined4 *)((long)&(this->distrib)._M_param._M_a + 4) = 0;
  *(undefined4 *)&(this->distrib)._M_param._M_b = 0;
  *(undefined4 *)((long)&(this->distrib)._M_param._M_b + 4) = 0x3ff00000;
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::mersenne_twister_engine(&this->gen);
  std::random_device::random_device(&rStack_2728);
  uVar1 = std::random_device::_M_getval();
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::seed(&local_13a0,(ulong)uVar1);
  memcpy(&this->gen,&local_13a0,5000);
  *(undefined4 *)&(this->distrib)._M_param._M_a = 0;
  *(undefined4 *)((long)&(this->distrib)._M_param._M_a + 4) = 0;
  *(undefined4 *)&(this->distrib)._M_param._M_b = 0;
  *(undefined4 *)((long)&(this->distrib)._M_param._M_b + 4) = 0x3ff00000;
  std::random_device::~random_device(&rStack_2728);
  return;
}

Assistant:

Distribution::Distribution() {
	std::random_device rd;		//Will be used to obtain a seed for the random number engine
	gen = std::mt19937 (rd());	//Standard mersenne_twister_engine seeded with rd()
	distrib = std::uniform_real_distribution<> (0,1);
}